

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O0

void Ree_ManComputeCutsTest(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  Vec_Int_t *vAdds_00;
  abctime aVar4;
  int nFadds;
  Vec_Int_t *vAdds;
  abctime clk;
  Gia_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  vAdds_00 = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar1 = Ree_ManCountFadds(vAdds_00);
  Ree_ManPrintAdders(vAdds_00,1);
  iVar2 = Vec_IntSize(vAdds_00);
  printf("Detected %d FAs and %d HAs.  ",(ulong)uVar1,(ulong)(iVar2 / 6 - uVar1));
  Vec_IntFree(vAdds_00);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  return;
}

Assistant:

void Ree_ManComputeCutsTest( Gia_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int nFadds = Ree_ManCountFadds( vAdds );
    Ree_ManPrintAdders( vAdds, 1 );
    printf( "Detected %d FAs and %d HAs.  ", nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Vec_IntFree( vAdds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}